

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int statement(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  node_t pvVar2;
  bool bVar3;
  
  iVar1 = compound_statement();
  if (iVar1 != 0) {
    return 1;
  }
  if (t->id == 0x83) {
    last_id = t->id;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    pvVar2 = assignment_expression();
    iVar1 = expect(0x3b);
    if (iVar1 != 0) {
      pvVar2 = jump(0x83,pvVar2);
      ast_add_node(pvVar2);
      return 1;
    }
    sync();
    if (extraout_EAX != 0) {
      return 1;
    }
  }
  pvVar2 = assignment_expression();
  if (pvVar2 == (node_t)0x0) {
    bVar3 = t->id == 0x3b;
    if (bVar3) {
      last_id = t->id;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
    }
  }
  else {
    iVar1 = expect(0x3b);
    if (iVar1 == 0) {
      sync();
      bVar3 = extraout_EAX_00 != 0;
    }
    else {
      ast_add_node(pvVar2);
      bVar3 = true;
    }
  }
  return (uint)bVar3;
}

Assistant:

int statement()
{
    if (compound_statement())
        return 1;
    else if (jump_statement())
        return 1;
    /* expression_statement() has to be the last in the list, as in case of
       error it will try to resync on a ";" and yield true if synced, making the
       statement an empty statement and allowing the parsing to continue */
    else if (expression_statement())
        return 1;

    return 0;
}